

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  ImVector<ImGuiColumnsSet> *this_00;
  value_type *pvVar1;
  int i;
  int i_00;
  
  if (this->DrawList == &this->DrawListInst) {
    IM_DELETE<char>(this->Name);
    this_00 = &this->ColumnsStorage;
    for (i_00 = 0; i_00 != this_00->Size; i_00 = i_00 + 1) {
      pvVar1 = ImVector<ImGuiColumnsSet>::operator[](this_00,i_00);
      ImVector<ImGuiColumnData>::~ImVector(&pvVar1->Columns);
    }
    ImDrawList::~ImDrawList(&this->DrawListInst);
    ImVector<ImGuiColumnsSet>::~ImVector(this_00);
    ImVector<ImGuiStorage::Pair>::~ImVector(&(this->StateStorage).Data);
    ImVector<unsigned_int>::~ImVector(&this->IDStack);
    ImGuiWindowTempData::~ImGuiWindowTempData(&this->DC);
    return;
  }
  __assert_fail("DrawList == &DrawListInst",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x7e6,"ImGuiWindow::~ImGuiWindow()");
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumnsSet();
}